

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_interp_decode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  stack *psVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t len;
  long lVar11;
  
  *A = 0;
  A[n] = 0x8000000;
  uVar6 = shuff_interp_decode::ss;
  uVar5 = SHUFF_ceil_log2(n);
  psVar4 = shuff_interp_decode::s;
  if (uVar6 < uVar5 + 1) {
    uVar6 = SHUFF_ceil_log2(n);
    shuff_interp_decode::s = (stack *)realloc(psVar4,uVar6 * 0x10 + 0x10);
    if (shuff_interp_decode::s == (stack *)0x0) {
      fwrite("Out of memory for stack\n",0x18,1,_stderr);
      exit(-1);
    }
    uVar6 = SHUFF_ceil_log2(n);
    shuff_interp_decode::ss = uVar6 + 1;
  }
  psVar4 = shuff_interp_decode::s;
  shuff_interp_decode::s->lo = 0;
  psVar4->hi = n;
  lVar9 = 1;
  while (uVar6 = 1, lVar9 != 0) {
    lVar10 = shuff_interp_decode::s[lVar9 + -1].lo;
    lVar2 = shuff_interp_decode::s[lVar9 + -1].hi;
    uVar7 = A[lVar2] - (A[lVar10] + (lVar2 - lVar10));
    lVar8 = uVar7 + 1;
    if (lVar8 != 1) {
      len = -1;
      for (; uVar7 != 0; uVar7 = uVar7 >> 1) {
        len = len + 1;
      }
      lVar8 = (1 << ((int)len + 1U & 0x1f)) - lVar8;
      uVar6 = SHUFF_INPUT_ULONG(bio,len);
      if (lVar8 <= (long)uVar6) {
        uVar5 = SHUFF_INPUT_BIT(bio);
        uVar6 = (uVar6 * 2 - lVar8) + uVar5;
      }
      uVar6 = uVar6 + 1;
    }
    lVar11 = lVar2 - lVar10 >> 1;
    lVar8 = lVar9 + -1;
    lVar1 = lVar11 + lVar10;
    A[lVar1] = uVar6;
    uVar3 = A[lVar10];
    uVar5 = (uVar6 - 1) + lVar11 + uVar3;
    A[lVar1] = uVar5;
    psVar4 = shuff_interp_decode::s;
    if (A[lVar2] - uVar5 == lVar2 - lVar1) {
      uVar6 = uVar6 + uVar3 + lVar11;
      for (lVar9 = lVar10 + 1 + lVar11; lVar9 < lVar2; lVar9 = lVar9 + 1) {
        A[lVar9] = uVar6;
        uVar6 = uVar6 + 1;
      }
    }
    else if (1 < lVar2 - lVar1) {
      shuff_interp_decode::s[lVar8].lo = lVar1;
      psVar4[lVar8].hi = lVar2;
      lVar8 = lVar9;
    }
    lVar9 = lVar8;
    psVar4 = shuff_interp_decode::s;
    uVar6 = A[lVar10];
    if (A[lVar1] - uVar6 == lVar11) {
      while( true ) {
        uVar6 = uVar6 + 1;
        lVar10 = lVar10 + 1;
        if (lVar1 <= lVar10) break;
        A[lVar10] = uVar6;
      }
    }
    else if (1 < lVar11) {
      shuff_interp_decode::s[lVar9].lo = lVar10;
      psVar4[lVar9].hi = lVar1;
      lVar9 = lVar9 + 1;
    }
  }
  return;
}

Assistant:

void shuff_interp_decode(bit_io_t* bio, uint64_t A[], uint64_t n)
{
    int64_t lo, hi, mid, range, j;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_DECODE(bio, A[mid], range);
        A[mid] += A[lo] + (mid - lo - 1);

        if (A[hi] - A[mid] == (uint64_t)(hi - mid)) // fill in the gaps of 1
            for (j = mid + 1; j < hi; j++)
                A[j] = A[j - 1] + 1;
        else if (hi - mid > 1)
            SHUFF_PUSH(mid, hi);

        if (A[mid] - A[lo] == (uint64_t)(mid - lo)) // fill in the gaps of 1
            for (j = lo + 1; j < mid; j++)
                A[j] = A[j - 1] + 1;
        else if (mid - lo > 1)
            SHUFF_PUSH(lo, mid);
    }
}